

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O1

void __thiscall juzzlin::SimpleLogger::Impl::flushEchoIfEnabled(Impl *this)

{
  mapped_type *ppbVar1;
  ostream *poVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  if (m_echoMode == '\x01') {
    ppbVar1 = std::
              map<juzzlin::SimpleLogger::Level,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::less<juzzlin::SimpleLogger::Level>,_std::allocator<std::pair<const_juzzlin::SimpleLogger::Level,_std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
              ::operator[]((map<juzzlin::SimpleLogger::Level,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::less<juzzlin::SimpleLogger::Level>,_std::allocator<std::pair<const_juzzlin::SimpleLogger::Level,_std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                            *)m_streams,&this->m_activeLevel);
    poVar2 = *ppbVar1;
    if (poVar2 != (ostream *)0x0) {
      std::__cxx11::stringbuf::str();
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_40,local_38);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void SimpleLogger::Impl::flushEchoIfEnabled()
{
    if (m_echoMode) {
        if (auto && stream = m_streams[m_activeLevel]; stream) {
            *stream << m_message.str() << std::endl;
            stream->flush();
        }
    }
}